

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O1

SSVectorBase<double> * __thiscall
soplex::SSVectorBase<double>::assign2product4setup<double,double>
          (SSVectorBase<double> *this,SVSetBase<double> *A,SSVectorBase<double> *x,Timer *timeSparse
          ,Timer *timeFull,int *nCallsSparse,int *nCallsFull)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  pointer pdVar6;
  DataKey *pDVar7;
  pointer pdVar8;
  Nonzero<double> *pNVar9;
  bool bVar10;
  bool bVar11;
  _func_int **pp_Var12;
  long lVar13;
  long lVar14;
  int *piVar15;
  int i;
  long lVar16;
  ulong uVar17;
  Item *pIVar18;
  long lVar19;
  Real RVar20;
  
  clear(this);
  uVar2 = (x->super_IdxSet).num;
  if ((ulong)uVar2 == 1) {
    if (timeSparse == (Timer *)0x0) {
      iVar3 = *(x->super_IdxSet).idx;
      dVar1 = (x->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[iVar3];
      pIVar18 = (A->set).theitem + (A->set).thekey[iVar3].idx;
      RVar20 = Tolerances::epsilon((this->_tolerances).
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      if (RVar20 < ABS(dVar1)) {
        uVar2 = (pIVar18->data).super_SVectorBase<double>.memused;
        uVar17 = (ulong)uVar2;
        if (uVar17 != 0) {
          (this->super_IdxSet).num = uVar2;
          if (0 < (int)uVar2) {
            piVar5 = (this->super_IdxSet).idx;
            pdVar6 = (this->super_VectorBase<double>).val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar13 = uVar17 + 1;
            piVar15 = &(pIVar18->data).super_SVectorBase<double>.m_elem[uVar17 - 1].idx;
            do {
              piVar5[lVar13 + -2] = *piVar15;
              pdVar6[*piVar15] = ((Nonzero<double> *)(piVar15 + -2))->val * dVar1;
              lVar13 = lVar13 + -1;
              piVar15 = piVar15 + -4;
            } while (1 < lVar13);
          }
          goto LAB_001f9572;
        }
      }
      clear(this);
LAB_001f9572:
      this->setupStatus = true;
      goto LAB_001f9577;
    }
    (*timeSparse->_vptr_Timer[3])(timeSparse);
    iVar3 = *(x->super_IdxSet).idx;
    dVar1 = (x->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar3];
    pIVar18 = (A->set).theitem + (A->set).thekey[iVar3].idx;
    RVar20 = Tolerances::epsilon((this->_tolerances).
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    if (RVar20 < ABS(dVar1)) {
      uVar2 = (pIVar18->data).super_SVectorBase<double>.memused;
      uVar17 = (ulong)uVar2;
      if (uVar17 != 0) {
        (this->super_IdxSet).num = uVar2;
        if (0 < (int)uVar2) {
          piVar5 = (this->super_IdxSet).idx;
          pdVar6 = (this->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar13 = uVar17 + 1;
          piVar15 = &(pIVar18->data).super_SVectorBase<double>.m_elem[uVar17 - 1].idx;
          do {
            piVar5[lVar13 + -2] = *piVar15;
            pdVar6[*piVar15] = ((Nonzero<double> *)(piVar15 + -2))->val * dVar1;
            lVar13 = lVar13 + -1;
            piVar15 = piVar15 + -4;
          } while (1 < lVar13);
        }
        goto LAB_001f9554;
      }
    }
    clear(this);
LAB_001f9554:
    this->setupStatus = true;
    pp_Var12 = timeSparse->_vptr_Timer;
  }
  else {
    if ((this->setupStatus == true) &&
       ((double)(A->super_ClassArray<soplex::Nonzero<double>_>).thesize * (double)(int)uVar2 <=
        (double)(A->set).thenum *
        (double)(int)((ulong)((long)(this->super_VectorBase<double>).val.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)(this->super_VectorBase<double>).val.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 3) * 0.5)) {
      if (timeSparse == (Timer *)0x0) {
        assign2productShort<double,double>(this,A,x);
        goto LAB_001f9572;
      }
      (*timeSparse->_vptr_Timer[3])(timeSparse);
      assign2productShort<double,double>(this,A,x);
      goto LAB_001f9554;
    }
    nCallsSparse = nCallsFull;
    if (timeFull == (Timer *)0x0) {
      if ((int)uVar2 < 1) {
LAB_001f951f:
        clear(this);
      }
      else {
        piVar5 = (x->super_IdxSet).idx;
        pdVar6 = (x->super_VectorBase<double>).val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pIVar18 = (A->set).theitem;
        pDVar7 = (A->set).thekey;
        pdVar8 = (this->super_VectorBase<double>).val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        bVar10 = true;
        uVar17 = 0;
        do {
          iVar3 = piVar5[uVar17];
          iVar4 = pDVar7[iVar3].idx;
          bVar11 = bVar10;
          if (bVar10) {
            bVar11 = false;
          }
          lVar13 = (long)pIVar18[iVar4].data.super_SVectorBase<double>.memused;
          if (0 < lVar13) {
            dVar1 = pdVar6[iVar3];
            pNVar9 = pIVar18[iVar4].data.super_SVectorBase<double>.m_elem;
            lVar16 = 0;
            do {
              iVar3 = *(int *)((long)&pNVar9->idx + lVar16);
              pdVar8[iVar3] = *(double *)((long)&pNVar9->val + lVar16) * dVar1 + pdVar8[iVar3];
              lVar16 = lVar16 + 0x10;
              bVar10 = bVar11;
            } while (lVar13 * 0x10 != lVar16);
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 != uVar2);
        if (bVar10) goto LAB_001f951f;
      }
      this->setupStatus = false;
      goto LAB_001f9577;
    }
    (*timeFull->_vptr_Timer[3])(timeFull);
    lVar13 = (long)(x->super_IdxSet).num;
    if (lVar13 < 1) {
LAB_001f93b6:
      clear(this);
    }
    else {
      piVar5 = (x->super_IdxSet).idx;
      pdVar6 = (x->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pIVar18 = (A->set).theitem;
      pDVar7 = (A->set).thekey;
      pdVar8 = (this->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      bVar10 = true;
      lVar16 = 0;
      do {
        iVar3 = piVar5[lVar16];
        iVar4 = pDVar7[iVar3].idx;
        bVar11 = bVar10;
        if (bVar10) {
          bVar11 = false;
        }
        lVar19 = (long)pIVar18[iVar4].data.super_SVectorBase<double>.memused;
        if (0 < lVar19) {
          dVar1 = pdVar6[iVar3];
          pNVar9 = pIVar18[iVar4].data.super_SVectorBase<double>.m_elem;
          lVar14 = 0;
          do {
            iVar3 = *(int *)((long)&pNVar9->idx + lVar14);
            pdVar8[iVar3] = *(double *)((long)&pNVar9->val + lVar14) * dVar1 + pdVar8[iVar3];
            lVar14 = lVar14 + 0x10;
            bVar10 = bVar11;
          } while (lVar19 * 0x10 != lVar14);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != lVar13);
      if (bVar10) goto LAB_001f93b6;
    }
    this->setupStatus = false;
    pp_Var12 = timeFull->_vptr_Timer;
    timeSparse = timeFull;
  }
  (*pp_Var12[4])(timeSparse);
LAB_001f9577:
  *nCallsSparse = *nCallsSparse + 1;
  return this;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assign2product4setup(const SVSetBase<S>& A,
      const SSVectorBase<T>& x,
      Timer* timeSparse, Timer* timeFull,
      int& nCallsSparse, int& nCallsFull
                                                      )
{
   assert(A.num() == x.dim());
   assert(x.isSetup());
   clear();

   if(x.size() == 1)
   {
      if(timeSparse != nullptr)
         timeSparse->start();

      assign2product1(A, x);
      setupStatus = true;

      if(timeSparse != nullptr)
         timeSparse->stop();

      ++nCallsSparse;
   }
   else if(isSetup()
           && (double(x.size()) * A.memSize() <= SOPLEX_SHORTPRODUCT_FACTOR * dim() * A.num()))
   {
      if(timeSparse != nullptr)
         timeSparse->start();

      assign2productShort(A, x);
      setupStatus = true;

      if(timeSparse != nullptr)
         timeSparse->stop();

      ++nCallsSparse;
   }
   else
   {
      if(timeFull != nullptr)
         timeFull->start();

      assign2productFull(A, x);
      setupStatus = false;

      if(timeFull != nullptr)
         timeFull->stop();

      ++nCallsFull;
   }

   assert(isConsistent());

   return *this;
}